

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O3

adjusted_mantissa
duckdb_fast_float::compute_float<duckdb_fast_float::binary_format<float>>(decimal *d)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong extraout_RAX;
  byte bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint32_t shift;
  uint8_t uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  double __x;
  adjusted_mantissa aVar20;
  
  uVar10 = d->num_digits;
  if (uVar10 == 0) {
LAB_00d6ddd2:
    uVar8 = 0;
  }
  else {
    uVar3 = d->decimal_point;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < -0x144) goto LAB_00d6ddd2;
    uVar8 = 0xff;
    uVar18 = 0;
    if (0x135 < (int)uVar3) goto LAB_00d6ddd7;
    if (0 < (int)uVar3) {
      uVar18 = 0;
      do {
        uVar3 = 0x3c;
        if ((uint)uVar4 < 0x13) {
          uVar3 = (uint)""[uVar4];
        }
        uVar14 = 0;
        uVar16 = 0;
LAB_00d6de21:
        bVar5 = (byte)uVar3;
        if (uVar10 != uVar14) goto code_r0x00d6de2a;
        if (uVar16 == 0) goto LAB_00d6df6a;
        uVar12 = uVar16 >> (bVar5 & 0x3f);
        uVar2 = uVar10;
        while (uVar14 = (ulong)uVar2, uVar12 == 0) {
          uVar16 = uVar16 * 10;
          uVar2 = uVar2 + 1;
          uVar12 = uVar16 >> (bVar5 & 0x3f);
        }
LAB_00d6de49:
        uVar13 = (uint)uVar14;
        uVar2 = ((uint)uVar4 - uVar13) + 1;
        uVar4 = (ulong)uVar2;
        d->decimal_point = uVar2;
        if ((int)uVar2 < -0x7ff) {
          d->negative = false;
          d->truncated = false;
          d->num_digits = 0;
          d->decimal_point = 0;
          uVar18 = (ulong)(uVar3 + (int)uVar18);
          uVar4 = 0;
          break;
        }
        uVar11 = ~(-1L << (bVar5 & 0x3f));
        bVar19 = uVar13 <= uVar10;
        uVar10 = uVar10 - uVar13;
        uVar12 = (ulong)uVar10;
        if (bVar19 && uVar10 != 0) {
          uVar15 = 0;
          do {
            uVar17 = uVar16 >> (bVar5 & 0x3f);
            uVar16 = (ulong)d->digits[uVar15 + (uVar14 & 0xffffffff)] + (uVar16 & uVar11) * 10;
            d->digits[uVar15] = (uint8_t)uVar17;
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
          if (uVar16 != 0) goto LAB_00d6def0;
          d->num_digits = uVar10;
LAB_00d6df2e:
          if (d->digits[(int)uVar12 - 1] == '\0') {
            do {
              iVar7 = (int)uVar12;
              if (iVar7 == 1) {
                uVar10 = 0;
                goto LAB_00d6df65;
              }
              uVar12 = uVar12 - 1;
            } while (d->digits[iVar7 - 2] == '\0');
            uVar10 = (uint)uVar12;
LAB_00d6df65:
            d->num_digits = iVar7 - 1;
          }
LAB_00d6df6a:
          if (-0x800 < (int)uVar4) goto LAB_00d6df75;
          goto LAB_00d6ddd2;
        }
        uVar12 = 0;
        if (uVar16 != 0) {
LAB_00d6def0:
          do {
            uVar9 = (uint8_t)(uVar16 >> (bVar5 & 0x3f));
            if ((uint)uVar12 < 0x300) {
              d->digits[uVar12] = uVar9;
              uVar12 = (ulong)((uint)uVar12 + 1);
            }
            else if (uVar9 != '\0') {
              d->truncated = true;
            }
            uVar10 = (uint)uVar12;
            uVar16 = (uVar16 & uVar11) * 10;
          } while (uVar16 != 0);
          d->num_digits = uVar10;
          goto LAB_00d6df2e;
        }
        d->num_digits = 0;
        uVar10 = 0;
LAB_00d6df75:
        uVar18 = (ulong)(uVar3 + (int)uVar18);
        if ((int)uVar4 < 1) break;
      } while( true );
    }
    do {
      uVar10 = (uint)uVar18;
      if ((int)uVar4 == 0) {
        if (4 < d->digits[0]) {
          uVar4 = 0;
          break;
        }
        shift = (d->digits[0] < 2) + 1;
      }
      else {
        uVar3 = -(int)uVar4;
        shift = 0x3c;
        if (uVar3 < 0x13) {
          shift = (uint32_t)""[uVar3];
        }
      }
      detail::decimal_left_shift(d,shift);
      uVar3 = d->decimal_point;
      uVar4 = (ulong)uVar3;
      if (0x7ff < (int)uVar3) goto LAB_00d6ddd4;
      uVar10 = uVar10 - shift;
      uVar18 = (ulong)uVar10;
    } while ((int)uVar3 < 1);
    iVar7 = uVar10 - 1;
    if ((int)uVar10 < -0x7d) {
      uVar10 = d->num_digits;
      do {
        uVar3 = -iVar7 - 0x7eU;
        if (0x3b < -iVar7 - 0x7eU) {
          uVar3 = 0x3c;
        }
        uVar16 = 0;
        uVar18 = 0;
LAB_00d6e021:
        bVar5 = (byte)uVar3;
        if (uVar10 != uVar16) goto code_r0x00d6e026;
        if (uVar18 == 0) goto LAB_00d6e17a;
        uVar14 = uVar18 >> (bVar5 & 0x3f);
        uVar2 = uVar10;
        while (uVar16 = (ulong)uVar2, uVar14 == 0) {
          uVar18 = uVar18 * 10;
          uVar2 = uVar2 + 1;
          uVar14 = uVar18 >> (bVar5 & 0x3f);
        }
LAB_00d6e045:
        uVar13 = (uint)uVar16;
        uVar2 = ((int)uVar4 - uVar13) + 1;
        uVar4 = (ulong)uVar2;
        d->decimal_point = uVar2;
        if ((int)uVar2 < -0x7ff) {
          d->negative = false;
          d->truncated = false;
          d->num_digits = 0;
          d->decimal_point = 0;
          uVar4 = 0;
LAB_00d6e065:
          uVar10 = 0;
        }
        else {
          uVar12 = ~(-1L << (bVar5 & 0x3f));
          bVar19 = uVar10 < uVar13;
          uVar10 = uVar10 - uVar13;
          uVar14 = (ulong)uVar10;
          if (bVar19 || uVar10 == 0) {
            uVar14 = 0;
            if (uVar18 != 0) goto LAB_00d6e0fc;
            d->num_digits = 0;
            goto LAB_00d6e065;
          }
          uVar11 = 0;
          do {
            uVar15 = uVar18 >> (bVar5 & 0x3f);
            uVar18 = (ulong)d->digits[uVar11 + (uVar16 & 0xffffffff)] + (uVar18 & uVar12) * 10;
            d->digits[uVar11] = (uint8_t)uVar15;
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
          if (uVar18 == 0) {
            d->num_digits = uVar10;
          }
          else {
LAB_00d6e0fc:
            do {
              uVar9 = (uint8_t)(uVar18 >> (bVar5 & 0x3f));
              if ((uint)uVar14 < 0x300) {
                d->digits[uVar14] = uVar9;
                uVar14 = (ulong)((uint)uVar14 + 1);
              }
              else if (uVar9 != '\0') {
                d->truncated = true;
              }
              uVar10 = (uint)uVar14;
              uVar16 = uVar18 & uVar12;
              uVar18 = uVar16 * 10;
            } while (uVar16 != 0);
            d->num_digits = uVar10;
          }
          if (d->digits[(int)uVar14 - 1] == '\0') {
            do {
              iVar6 = (int)uVar14;
              if (iVar6 == 1) {
                uVar10 = 0;
                goto LAB_00d6e175;
              }
              uVar14 = uVar14 - 1;
            } while (d->digits[iVar6 - 2] == '\0');
            uVar10 = (uint)uVar14;
LAB_00d6e175:
            d->num_digits = iVar6 - 1;
          }
        }
LAB_00d6e17a:
        iVar7 = uVar3 + iVar7;
        if (-0x7f < iVar7) break;
      } while( true );
    }
    uVar10 = iVar7 + 0x7f;
    if (uVar10 < 0xff) {
      detail::decimal_left_shift(d,0x18);
      uVar3 = d->num_digits;
      if ((ulong)uVar3 == 0) {
LAB_00d6e1f6:
        uVar18 = 0;
LAB_00d6e1f9:
        uVar10 = uVar10 - 1;
      }
      else {
        uVar2 = d->decimal_point;
        uVar4 = (ulong)uVar2;
        if ((int)uVar2 < 0) goto LAB_00d6e1f6;
        if (uVar2 < 0x13) {
          if (uVar4 == 0) {
            uVar18 = 0;
          }
          else {
            uVar16 = 0;
            uVar18 = 0;
            do {
              if (uVar16 < uVar3) {
                uVar14 = (ulong)d->digits[uVar16];
              }
              else {
                uVar14 = 0;
              }
              uVar18 = uVar18 * 10 + uVar14;
              uVar16 = uVar16 + 1;
            } while (uVar4 != uVar16);
          }
          if (uVar2 < uVar3) {
            if (uVar2 + 1 == uVar3 && d->digits[uVar4] == 5) {
              if ((d->truncated != false) || ((uVar4 != 0 && ((d->digits[uVar2 - 1] & 1) != 0)))) {
LAB_00d6e249:
                uVar18 = uVar18 + 1;
              }
            }
            else if (4 < d->digits[uVar4]) goto LAB_00d6e249;
          }
          if (0xffffff < uVar18) goto LAB_00d6e255;
        }
        else {
LAB_00d6e255:
          detail::decimal_right_shift(d,1);
          detail::round(__x);
          if (0x7e < iVar7) goto LAB_00d6ddd4;
          uVar10 = iVar7 + 0x80;
          uVar18 = extraout_RAX;
        }
        if (uVar18 < 0x800000) goto LAB_00d6e1f9;
      }
      uVar8 = (ulong)uVar10;
      uVar18 = (ulong)((uint)uVar18 & 0x7fffff);
      goto LAB_00d6ddd7;
    }
  }
LAB_00d6ddd4:
  uVar18 = 0;
LAB_00d6ddd7:
  aVar20._8_8_ = uVar8;
  aVar20.mantissa = uVar18;
  return aVar20;
code_r0x00d6de2a:
  puVar1 = d->digits + uVar14;
  uVar14 = uVar14 + 1;
  uVar16 = (ulong)*puVar1 + uVar16 * 10;
  if (uVar16 >> (bVar5 & 0x3f) != 0) goto LAB_00d6de49;
  goto LAB_00d6de21;
code_r0x00d6e026:
  puVar1 = d->digits + uVar16;
  uVar16 = uVar16 + 1;
  uVar18 = (ulong)*puVar1 + uVar18 * 10;
  if (uVar18 >> (bVar5 & 0x3f) != 0) goto LAB_00d6e045;
  goto LAB_00d6e021;
}

Assistant:

adjusted_mantissa compute_float(decimal &d) {
  adjusted_mantissa answer;
  if (d.num_digits == 0) {
    // should be zero
    answer.power2 = 0;
    answer.mantissa = 0;
    return answer;
  }
  // At this point, going further, we can assume that d.num_digits > 0.
  //
  // We want to guard against excessive decimal point values because
  // they can result in long running times. Indeed, we do
  // shifts by at most 60 bits. We have that log(10**400)/log(2**60) ~= 22
  // which is fine, but log(10**299995)/log(2**60) ~= 16609 which is not
  // fine (runs for a long time).
  //
  if(d.decimal_point < -324) {
    // We have something smaller than 1e-324 which is always zero
    // in binary64 and binary32.
    // It should be zero.
    answer.power2 = 0;
    answer.mantissa = 0;
    return answer;
  } else if(d.decimal_point >= 310) {
    // We have something at least as large as 0.1e310 which is
    // always infinite.  
    answer.power2 = binary::infinite_power();
    answer.mantissa = 0;
    return answer;
  }
  static const uint32_t max_shift = 60;
  static const uint32_t num_powers = 19;
  static const uint8_t decimal_powers[19] = {
      0,  3,  6,  9,  13, 16, 19, 23, 26, 29, //
      33, 36, 39, 43, 46, 49, 53, 56, 59,     //
  };
  int32_t exp2 = 0;
  while (d.decimal_point > 0) {
    uint32_t n = uint32_t(d.decimal_point);
    uint32_t shift = (n < num_powers) ? decimal_powers[n] : max_shift;
    detail::decimal_right_shift(d, shift);
    if (d.decimal_point < -decimal_point_range) {
      // should be zero
      answer.power2 = 0;
      answer.mantissa = 0;
      return answer;
    }
    exp2 += int32_t(shift);
  }
  // We shift left toward [1/2 ... 1].
  while (d.decimal_point <= 0) {
    uint32_t shift;
    if (d.decimal_point == 0) {
      if (d.digits[0] >= 5) {
        break;
      }
      shift = (d.digits[0] < 2) ? 2 : 1;
    } else {
      uint32_t n = uint32_t(-d.decimal_point);
      shift = (n < num_powers) ? decimal_powers[n] : max_shift;
    }
    detail::decimal_left_shift(d, shift);
    if (d.decimal_point > decimal_point_range) {
      // we want to get infinity:
      answer.power2 = binary::infinite_power();
      answer.mantissa = 0;
      return answer;
    }
    exp2 -= int32_t(shift);
  }
  // We are now in the range [1/2 ... 1] but the binary format uses [1 ... 2].
  exp2--;
  constexpr int32_t minimum_exponent = binary::minimum_exponent();
  while ((minimum_exponent + 1) > exp2) {
    uint32_t n = uint32_t((minimum_exponent + 1) - exp2);
    if (n > max_shift) {
      n = max_shift;
    }
    detail::decimal_right_shift(d, n);
    exp2 += int32_t(n);
  }
  if ((exp2 - minimum_exponent) >= binary::infinite_power()) {
    answer.power2 = binary::infinite_power();
    answer.mantissa = 0;
    return answer;
  }

  const int mantissa_size_in_bits = binary::mantissa_explicit_bits() + 1;
  detail::decimal_left_shift(d, mantissa_size_in_bits);

  uint64_t mantissa = detail::round(d);
  // It is possible that we have an overflow, in which case we need
  // to shift back.
  if(mantissa >= (uint64_t(1) << mantissa_size_in_bits)) {
    detail::decimal_right_shift(d, 1);
    exp2 += 1;
    mantissa = detail::round(d);
    if ((exp2 - minimum_exponent) >= binary::infinite_power()) {
      answer.power2 = binary::infinite_power();
      answer.mantissa = 0;
      return answer;
    }
  }
  answer.power2 = exp2  - binary::minimum_exponent();
  if(mantissa < (uint64_t(1) << binary::mantissa_explicit_bits())) { answer.power2--; }
  answer.mantissa = mantissa & ((uint64_t(1) << binary::mantissa_explicit_bits()) - 1);
  return answer;
}